

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BalanceFunction.cpp
# Opt level: O2

void __thiscall
BalanceFunction::BalanceFunction
          (BalanceFunction *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  int i;
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  value_type_conflict local_150;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_148;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_140;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_138;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_130;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_128;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&this->paraRdr_,paraRdr);
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  (this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pretty_ostream::pretty_ostream(&this->messager);
  local_118 = &this->C_abarbbar;
  local_128 = &this->C_abbar;
  local_120 = &this->C_abarb;
  local_130 = &this->C_mixed_ab;
  local_138 = &this->C_mixed_abarbbar;
  local_148 = &this->C_mixed_abbar;
  local_140 = &this->C_mixed_abarb;
  memset(&this->C_ab,0,0xc0);
  std::__weak_ptr<RandomUtil::Random,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<RandomUtil::Random,(__gnu_cxx::_Lock_policy)2> *)&this->ran_gen_ptr,
             &ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_50,"particle_alpha",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_50);
  this->particle_monval_a = (int)dVar3;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"particle_beta",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_70);
  this->particle_monval_b = (int)dVar3;
  std::__cxx11::string::~string((string *)&local_70);
  this->same_species = this->particle_monval_a + this->particle_monval_b == 0;
  std::__cxx11::string::string((string *)&local_90,"BpT_min",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_90);
  this->BpT_min = dVar3;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"BpT_max",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_b0);
  this->BpT_max = dVar3;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"Bnpts",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_d0);
  this->Bnpts = (int)dVar3;
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"Brap_max",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_f0);
  this->Brap_max = dVar3;
  std::__cxx11::string::~string((string *)&local_f0);
  dVar3 = ABS(this->Brap_max);
  dVar4 = (dVar3 + dVar3) / (double)(this->Bnpts + -1);
  this->drap = dVar4;
  this->Brap_min = dVar4 * -0.5 - dVar3;
  this->Bnphi = 0x14;
  this->dphi = 0.3141592653589793;
  this->Bphi_min = -1.5707963267948966;
  std::__cxx11::string::string((string *)&local_110,"rap_type",(allocator *)&local_150);
  dVar3 = ParameterReader::getVal(&this->paraRdr_,&local_110);
  this->rap_type_ = (int)dVar3;
  std::__cxx11::string::~string((string *)&local_110);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->C_ab,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_118,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_120,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_128,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_130,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_138,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_140,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_148,(long)this->Bnpts);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < this->Bnpts; lVar1 = lVar1 + 1) {
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_ab).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_abarbbar).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_abarb).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_abbar).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_mixed_ab).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_mixed_abarbbar).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_mixed_abarb).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    local_150 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->C_mixed_abbar).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->Bnphi,&local_150);
    lVar2 = lVar2 + 0x18;
  }
  this->N_b = 0;
  this->N_bbar = 0;
  return;
}

Assistant:

BalanceFunction::BalanceFunction(
    const ParameterReader& paraRdr, const std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr = ran_gen;

    particle_monval_a = paraRdr_.getVal("particle_alpha");
    particle_monval_b = paraRdr_.getVal("particle_beta");
    if (particle_monval_a == -particle_monval_b)
        same_species = true;
    else
        same_species = false;

    BpT_min = paraRdr_.getVal("BpT_min");
    BpT_max = paraRdr_.getVal("BpT_max");
    Bnpts = paraRdr_.getVal("Bnpts");
    Brap_max = paraRdr_.getVal("Brap_max");
    drap = 2. * std::abs(Brap_max) / (Bnpts - 1);
    Brap_min = -std::abs(Brap_max) - 0.5 * drap;
    Bnphi = 20;
    dphi = 2. * M_PI / Bnphi;
    Bphi_min = -M_PI / 2.;

    rap_type_ = paraRdr_.getVal("rap_type");

    C_ab.resize(Bnpts);
    C_abarbbar.resize(Bnpts);
    C_abarb.resize(Bnpts);
    C_abbar.resize(Bnpts);
    C_mixed_ab.resize(Bnpts);
    C_mixed_abarbbar.resize(Bnpts);
    C_mixed_abarb.resize(Bnpts);
    C_mixed_abbar.resize(Bnpts);
    for (int i = 0; i < Bnpts; i++) {
        C_ab[i].assign(Bnphi, 0.);
        C_abarbbar[i].assign(Bnphi, 0.);
        C_abarb[i].assign(Bnphi, 0.);
        C_abbar[i].assign(Bnphi, 0.);
        C_mixed_ab[i].assign(Bnphi, 0.);
        C_mixed_abarbbar[i].assign(Bnphi, 0.);
        C_mixed_abarb[i].assign(Bnphi, 0.);
        C_mixed_abbar[i].assign(Bnphi, 0.);
    }

    N_b = 0;
    N_bbar = 0;
}